

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O2

void push0_pipe_ready(push0_pipe *p)

{
  push0_sock *lmq;
  _Bool _Var1;
  int iVar2;
  nni_aio *aio;
  size_t count;
  bool bVar3;
  nni_msg *local_38;
  nni_msg *m;
  
  lmq = p->push;
  nni_mtx_lock(&lmq->m);
  _Var1 = nni_lmq_full(&lmq->wq);
  if (_Var1) {
    iVar2 = nni_list_empty(&lmq->pl);
    bVar3 = iVar2 != 0;
  }
  else {
    bVar3 = false;
  }
  iVar2 = nni_lmq_get(&lmq->wq,&local_38);
  if (iVar2 == 0) {
    nni_aio_set_msg(&p->aio_send,local_38);
    nni_pipe_send(p->pipe,&p->aio_send);
    aio = (nni_aio *)nni_list_first(&lmq->aq);
    if (aio == (nni_aio *)0x0) goto LAB_0011d90c;
    nni_aio_list_remove(aio);
    local_38 = nni_aio_get_msg(aio);
    count = nni_msg_len(local_38);
    nni_lmq_put(&lmq->wq,local_38);
  }
  else {
    aio = (nni_aio *)nni_list_first(&lmq->aq);
    if (aio == (nni_aio *)0x0) {
      nni_list_append(&lmq->pl,p);
LAB_0011d90c:
      count = 0;
      aio = (nni_aio *)0x0;
    }
    else {
      nni_aio_list_remove(aio);
      local_38 = nni_aio_get_msg(aio);
      count = nni_msg_len(local_38);
      nni_aio_set_msg(&p->aio_send,local_38);
      nni_pipe_send(p->pipe,&p->aio_send);
    }
  }
  if (bVar3) {
    _Var1 = nni_lmq_full(&lmq->wq);
    if (_Var1) {
      iVar2 = nni_list_empty(&lmq->pl);
      if (iVar2 != 0) goto LAB_0011d93c;
    }
    nni_pollable_raise(&lmq->writable);
  }
LAB_0011d93c:
  nni_mtx_unlock(&lmq->m);
  if (aio != (nni_aio *)0x0) {
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish_sync(aio,NNG_OK,count);
  }
  return;
}

Assistant:

static void
push0_pipe_ready(push0_pipe *p)
{
	push0_sock *s = p->push;
	nni_msg    *m;
	nni_aio    *a = NULL;
	size_t      l = 0;
	bool        blocked;

	nni_mtx_lock(&s->m);

	blocked = nni_lmq_full(&s->wq) && nni_list_empty(&s->pl);

	// if  message is waiting in the buffered queue
	// then we prefer that.
	if (nni_lmq_get(&s->wq, &m) == 0) {
		nni_aio_set_msg(&p->aio_send, m);
		nni_pipe_send(p->pipe, &p->aio_send);

		if ((a = nni_list_first(&s->aq)) != NULL) {
			nni_aio_list_remove(a);
			m = nni_aio_get_msg(a);
			l = nni_msg_len(m);
			nni_lmq_put(&s->wq, m);
		}

	} else if ((a = nni_list_first(&s->aq)) != NULL) {
		// Looks like we had the unbuffered case, but
		// someone was waiting.
		nni_aio_list_remove(a);
		m = nni_aio_get_msg(a);
		l = nni_msg_len(m);

		nni_aio_set_msg(&p->aio_send, m);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		// We had nothing to send.  Just put us in the ready list.
		nni_list_append(&s->pl, p);
	}

	if (blocked) {
		// if we blocked, then toggle the status.
		if ((!nni_lmq_full(&s->wq)) || (!nni_list_empty(&s->pl))) {
			nni_pollable_raise(&s->writable);
		}
	}

	nni_mtx_unlock(&s->m);

	if (a != NULL) {
		nni_aio_set_msg(a, NULL);
		nni_aio_finish_sync(a, 0, l);
	}
}